

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall crnd::crn_unpacker::init_tables(crn_unpacker *this)

{
  symbol_codec *this_00;
  crn_header *pcVar1;
  bool bVar2;
  uint8 *puVar3;
  ushort uVar4;
  
  pcVar1 = this->m_pHeader;
  uVar4 = *(ushort *)(pcVar1->m_tables_size).m_buf;
  uVar4 = uVar4 << 8 | uVar4 >> 8;
  if (uVar4 != 0) {
    this_00 = &this->m_codec;
    puVar3 = this->m_pData +
             ((ulong)(pcVar1->m_tables_ofs).m_buf[2] |
             (ulong)((uint)(pcVar1->m_tables_ofs).m_buf[0] << 0x10 |
                    (uint)(pcVar1->m_tables_ofs).m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar3;
    (this->m_codec).m_pDecode_buf_next = puVar3;
    (this->m_codec).m_decode_buf_size = (uint)uVar4;
    (this->m_codec).m_pDecode_buf_end = puVar3 + (uint)uVar4;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
    bVar2 = symbol_codec::decode_receive_static_data_model(this_00,&this->m_reference_encoding_dm);
    if (!bVar2) {
      return false;
    }
    uVar4 = *(ushort *)(this->m_pHeader->m_color_endpoints).m_num.m_buf;
    if ((uVar4 & 0xff) == 0 && uVar4 >> 8 == 0) {
      uVar4 = *(ushort *)(this->m_pHeader->m_alpha_endpoints).m_num.m_buf;
      if ((uVar4 & 0xff) == 0 && uVar4 >> 8 == 0) {
        return false;
      }
    }
    else {
      bVar2 = symbol_codec::decode_receive_static_data_model(this_00,this->m_endpoint_delta_dm);
      if (!bVar2) {
        return false;
      }
      bVar2 = symbol_codec::decode_receive_static_data_model(this_00,this->m_selector_delta_dm);
      if (!bVar2) {
        return false;
      }
      uVar4 = *(ushort *)(this->m_pHeader->m_alpha_endpoints).m_num.m_buf;
      if ((uVar4 & 0xff) == 0 && uVar4 >> 8 == 0) {
        return true;
      }
    }
    bVar2 = symbol_codec::decode_receive_static_data_model(this_00,this->m_endpoint_delta_dm + 1);
    if ((bVar2) &&
       (bVar2 = symbol_codec::decode_receive_static_data_model
                          (this_00,this->m_selector_delta_dm + 1), bVar2)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool init_tables()
        {
            if (!m_codec.start_decoding(m_pData + m_pHeader->m_tables_ofs, m_pHeader->m_tables_size))
                return false;

            if (!m_codec.decode_receive_static_data_model(m_reference_encoding_dm))
                return false;

            if ((!m_pHeader->m_color_endpoints.m_num) && (!m_pHeader->m_alpha_endpoints.m_num))
                return false;

            if (m_pHeader->m_color_endpoints.m_num)
            {
                if (!m_codec.decode_receive_static_data_model(m_endpoint_delta_dm[0]))
                    return false;
                if (!m_codec.decode_receive_static_data_model(m_selector_delta_dm[0]))
                    return false;
            }

            if (m_pHeader->m_alpha_endpoints.m_num)
            {
                if (!m_codec.decode_receive_static_data_model(m_endpoint_delta_dm[1]))
                    return false;
                if (!m_codec.decode_receive_static_data_model(m_selector_delta_dm[1]))
                    return false;
            }

            m_codec.stop_decoding();

            return true;
        }